

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O3

int TIFFInitCCITTFax3(TIFF *tif,int scheme)

{
  int iVar1;
  
  iVar1 = InitCCITTFax3(tif);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = _TIFFMergeFields(tif,fax3Fields,1);
    if (iVar1 != 0) {
      iVar1 = TIFFSetField(tif,0x10000,1);
      return iVar1;
    }
    iVar1 = 0;
    TIFFErrorExtR(tif,"TIFFInitCCITTFax3","Merging CCITT Fax 3 codec-specific tags failed");
  }
  return iVar1;
}

Assistant:

int TIFFInitCCITTFax3(TIFF *tif, int scheme)
{
    (void)scheme;
    if (InitCCITTFax3(tif))
    {
        /*
         * Merge codec-specific tag information.
         */
        if (!_TIFFMergeFields(tif, fax3Fields, TIFFArrayCount(fax3Fields)))
        {
            TIFFErrorExtR(tif, "TIFFInitCCITTFax3",
                          "Merging CCITT Fax 3 codec-specific tags failed");
            return 0;
        }

        /*
         * The default format is Class/F-style w/o RTC.
         */
        return TIFFSetField(tif, TIFFTAG_FAXMODE, FAXMODE_CLASSF);
    }
    else
        return 01;
}